

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

int AF__FTranslatedLineTarget_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int damage;
  FTranslatedLineTarget *t;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  AActor *puff;
  bool bVar5;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar4 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x03') {
              t = (FTranslatedLineTarget *)(param->field_0).field_1.a;
              damage = param[1].field_0.i;
              if ((param[2].field_0.field_1.atag == 1) ||
                 (param[2].field_0.field_1.a == (void *)0x0)) {
                puff = (AActor *)param[2].field_0.field_1.a;
                if (puff == (AActor *)0x0) {
                  NullParam("\"missile\"");
                  puff = (AActor *)param[2].field_0.field_1.a;
                }
                pPVar1 = AActor::RegistrationInfo.MyClass;
                if (puff != (AActor *)0x0) {
                  if ((puff->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                    iVar2 = (**(puff->super_DThinker).super_DObject._vptr_DObject)(puff);
                    (puff->super_DThinker).super_DObject.Class =
                         (PClass *)CONCAT44(extraout_var,iVar2);
                  }
                  pPVar3 = (puff->super_DThinker).super_DObject.Class;
                  bVar5 = pPVar3 != (PClass *)0x0;
                  if (pPVar3 != pPVar1 && bVar5) {
                    do {
                      pPVar3 = pPVar3->ParentClass;
                      bVar5 = pPVar3 != (PClass *)0x0;
                      if (pPVar3 == pPVar1) break;
                    } while (pPVar3 != (PClass *)0x0);
                  }
                  if (!bVar5) {
                    pcVar4 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
                    goto LAB_00416dd1;
                  }
                }
                P_TraceBleed(damage,t,puff);
                return 0;
              }
            }
            pcVar4 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_00416dd1:
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                        ,0x12b2,
                        "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x12b1,
                    "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x12b0,
                "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(_FTranslatedLineTarget, TraceBleed)
{
	PARAM_SELF_STRUCT_PROLOGUE(FTranslatedLineTarget);
	PARAM_INT(damage);
	PARAM_OBJECT_NOT_NULL(missile, AActor);

	P_TraceBleed(damage, self, missile);
	return 0;
}